

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_GetGlyphHMetrics
               (stbtt_fontinfo *info,int glyph_index,int *advanceWidth,int *leftSideBearing)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ushort uVar5;
  ulong uVar6;
  
  puVar1 = info->data;
  uVar5 = *(ushort *)(puVar1 + (long)info->hhea + 0x22) << 8 |
          *(ushort *)(puVar1 + (long)info->hhea + 0x22) >> 8;
  uVar6 = (ulong)uVar5;
  if (glyph_index < (int)(uint)uVar5) {
    if (advanceWidth != (int *)0x0) {
      *advanceWidth =
           (int)(short)((ushort)puVar1[(long)glyph_index * 4 + (long)info->hmtx] << 8) |
           (uint)puVar1[(long)glyph_index * 4 + (long)info->hmtx + 1];
    }
    if (leftSideBearing == (int *)0x0) {
      return;
    }
    lVar2 = (long)(glyph_index << 2) + (long)info->hmtx + 2;
    lVar3 = (long)(glyph_index << 2) + (long)info->hmtx + 3;
  }
  else {
    if (advanceWidth != (int *)0x0) {
      *advanceWidth =
           (int)(short)((ushort)puVar1[uVar6 * 4 + (long)info->hmtx + -4] << 8) |
           (uint)puVar1[uVar6 * 4 + (long)info->hmtx + -3];
    }
    if (leftSideBearing == (int *)0x0) {
      return;
    }
    lVar3 = uVar6 * 4 + (long)info->hmtx;
    lVar4 = (long)(int)((glyph_index - (uint)uVar5) * 2);
    lVar2 = lVar4 + lVar3;
    lVar3 = lVar4 + lVar3 + 1;
  }
  *leftSideBearing = (int)(short)((ushort)puVar1[lVar2] << 8) | (uint)puVar1[lVar3];
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphHMetrics(const stbtt_fontinfo *info, int glyph_index, int *advanceWidth, int *leftSideBearing)
{
   stbtt_uint16 numOfLongHorMetrics = ttUSHORT(info->data+info->hhea + 34);
   if (glyph_index < numOfLongHorMetrics) {
      if (advanceWidth)     *advanceWidth    = ttSHORT(info->data + info->hmtx + 4*glyph_index);
      if (leftSideBearing)  *leftSideBearing = ttSHORT(info->data + info->hmtx + 4*glyph_index + 2);
   } else {
      if (advanceWidth)     *advanceWidth    = ttSHORT(info->data + info->hmtx + 4*(numOfLongHorMetrics-1));
      if (leftSideBearing)  *leftSideBearing = ttSHORT(info->data + info->hmtx + 4*numOfLongHorMetrics + 2*(glyph_index - numOfLongHorMetrics));
   }
}